

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_16777232,_true,_embree::avx2::SubGridMBIntersector1Pluecker<8,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  Geometry *pGVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  RTCIntersectArguments *pRVar21;
  RTCRayQueryContext *pRVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  byte bVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  RayHit *pRVar72;
  int iVar73;
  uint uVar74;
  AABBNodeMB4D *node1;
  ulong uVar75;
  long lVar76;
  ulong uVar77;
  undefined1 (*pauVar78) [16];
  long lVar79;
  long lVar80;
  uint uVar81;
  long lVar82;
  undefined1 (*pauVar83) [16];
  ulong uVar84;
  long lVar85;
  undefined1 (*pauVar86) [16];
  long lVar87;
  ulong uVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar107;
  float fVar108;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar109;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar110;
  float fVar118;
  float fVar119;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar120;
  undefined1 auVar117 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  float fVar127;
  undefined8 uVar128;
  float fVar138;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar137;
  float fVar139;
  undefined1 auVar136 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar200 [32];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  vint8 bi;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2a20) [16];
  undefined1 local_2a11;
  long local_2a10;
  ulong local_2a08;
  uint local_29fc;
  uint local_29f8;
  int local_29f4;
  ulong local_29f0;
  ulong local_29e8;
  undefined1 local_29e0 [32];
  float local_29c0;
  float fStack_29bc;
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  float fStack_29a4;
  undefined1 local_29a0 [40];
  long local_2978;
  ulong local_2970;
  ulong local_2968;
  ulong local_2960;
  ulong local_2958;
  ulong local_2950;
  ulong local_2948;
  long local_2940;
  ulong local_2938;
  RayHit *local_2930;
  RayQueryContext *local_2928;
  long local_2920;
  long local_2918;
  Scene *local_2910;
  ulong local_2908;
  RTCFilterFunctionNArguments local_2900;
  float local_28d0;
  float local_28cc;
  float local_28c8;
  undefined4 local_28c4;
  undefined4 local_28c0;
  undefined4 local_28bc;
  undefined4 local_28b8;
  uint local_28b4;
  uint local_28b0;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  float local_2780;
  float fStack_277c;
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [32];
  undefined1 *local_2740;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  float local_2660 [4];
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined4 local_2600;
  undefined4 uStack_25fc;
  undefined4 uStack_25f8;
  undefined4 uStack_25f4;
  undefined4 uStack_25f0;
  undefined4 uStack_25ec;
  undefined4 uStack_25e8;
  undefined4 uStack_25e4;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined4 local_2560;
  undefined4 uStack_255c;
  undefined4 uStack_2558;
  undefined4 uStack_2554;
  undefined4 uStack_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar90 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar101 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar89._8_4_ = 0x7fffffff;
      auVar89._0_8_ = 0x7fffffff7fffffff;
      auVar89._12_4_ = 0x7fffffff;
      auVar89 = vandps_avx((undefined1  [16])aVar2,auVar89);
      auVar129._8_4_ = 0x219392ef;
      auVar129._0_8_ = 0x219392ef219392ef;
      auVar129._12_4_ = 0x219392ef;
      auVar89 = vcmpps_avx(auVar89,auVar129,1);
      auVar130._8_4_ = 0x3f800000;
      auVar130._0_8_ = &DAT_3f8000003f800000;
      auVar130._12_4_ = 0x3f800000;
      auVar129 = vdivps_avx(auVar130,(undefined1  [16])aVar2);
      auVar131._8_4_ = 0x5d5e0b6b;
      auVar131._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar131._12_4_ = 0x5d5e0b6b;
      auVar89 = vblendvps_avx(auVar129,auVar131,auVar89);
      local_2a20 = (undefined1 (*) [16])local_2390;
      auVar124._0_4_ = auVar89._0_4_ * 0.99999964;
      auVar124._4_4_ = auVar89._4_4_ * 0.99999964;
      auVar124._8_4_ = auVar89._8_4_ * 0.99999964;
      auVar124._12_4_ = auVar89._12_4_ * 0.99999964;
      uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_2860._4_4_ = uVar1;
      local_2860._0_4_ = uVar1;
      local_2860._8_4_ = uVar1;
      local_2860._12_4_ = uVar1;
      local_2860._16_4_ = uVar1;
      local_2860._20_4_ = uVar1;
      local_2860._24_4_ = uVar1;
      local_2860._28_4_ = uVar1;
      auVar160 = ZEXT3264(local_2860);
      uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_2880._4_4_ = uVar1;
      local_2880._0_4_ = uVar1;
      local_2880._8_4_ = uVar1;
      local_2880._12_4_ = uVar1;
      local_2880._16_4_ = uVar1;
      local_2880._20_4_ = uVar1;
      local_2880._24_4_ = uVar1;
      local_2880._28_4_ = uVar1;
      auVar111._0_4_ = auVar89._0_4_ * 1.0000004;
      auVar111._4_4_ = auVar89._4_4_ * 1.0000004;
      auVar111._8_4_ = auVar89._8_4_ * 1.0000004;
      auVar111._12_4_ = auVar89._12_4_ * 1.0000004;
      local_2560 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      uStack_255c = local_2560;
      uStack_2558 = local_2560;
      uStack_2554 = local_2560;
      uStack_2550 = local_2560;
      uStack_254c = local_2560;
      uStack_2548 = local_2560;
      uStack_2544 = local_2560;
      auVar89 = vmovshdup_avx(auVar124);
      uVar128 = auVar89._0_8_;
      register0x00001488 = uVar128;
      local_2640 = uVar128;
      register0x00001490 = uVar128;
      register0x00001498 = uVar128;
      auVar130 = vshufpd_avx(auVar124,auVar124,1);
      auVar129 = vshufps_avx(auVar124,auVar124,0xaa);
      local_2580 = auVar129._0_8_;
      uStack_2578 = local_2580;
      uStack_2570 = local_2580;
      uStack_2568 = local_2580;
      local_25a0 = auVar111._0_4_;
      fStack_259c = auVar111._0_4_;
      fStack_2598 = auVar111._0_4_;
      fStack_2594 = auVar111._0_4_;
      fStack_2590 = auVar111._0_4_;
      fStack_258c = auVar111._0_4_;
      fStack_2588 = auVar111._0_4_;
      fStack_2584 = auVar111._0_4_;
      auVar129 = vmovshdup_avx(auVar111);
      local_25c0 = auVar129._0_8_;
      uStack_25b8 = local_25c0;
      uStack_25b0 = local_25c0;
      uStack_25a8 = local_25c0;
      auVar129 = vshufps_avx(auVar111,auVar111,0xaa);
      local_25e0 = auVar129._0_8_;
      uStack_25d8 = local_25e0;
      uStack_25d0 = local_25e0;
      uStack_25c8 = local_25e0;
      local_2948 = (ulong)(auVar124._0_4_ < 0.0) << 5;
      local_2950 = (ulong)(auVar89._0_4_ < 0.0) << 5 | 0x40;
      auVar144 = ZEXT3264(local_2880);
      auVar165 = ZEXT3264(_local_2640);
      local_2958 = (ulong)(auVar130._0_4_ < 0.0) << 5 | 0x80;
      local_2960 = local_2948 ^ 0x20;
      local_2968 = local_2950 ^ 0x20;
      local_2970 = local_2958 ^ 0x20;
      local_2600 = auVar90._0_4_;
      uStack_25fc = local_2600;
      uStack_25f8 = local_2600;
      uStack_25f4 = local_2600;
      uStack_25f0 = local_2600;
      uStack_25ec = local_2600;
      uStack_25e8 = local_2600;
      uStack_25e4 = local_2600;
      local_2840 = auVar101._0_4_;
      fStack_283c = local_2840;
      fStack_2838 = local_2840;
      fStack_2834 = local_2840;
      fStack_2830 = local_2840;
      fStack_282c = local_2840;
      fStack_2828 = local_2840;
      fStack_2824 = local_2840;
      local_2540._16_16_ = mm_lookupmask_ps._240_16_;
      local_2540._0_16_ = mm_lookupmask_ps._240_16_;
      local_2500 = vperm2f128_avx(local_2540,mm_lookupmask_ps._0_32_,2);
      auVar114._8_4_ = 0x3f800000;
      auVar114._0_8_ = &DAT_3f8000003f800000;
      auVar114._12_4_ = 0x3f800000;
      auVar114._16_4_ = 0x3f800000;
      auVar114._20_4_ = 0x3f800000;
      auVar114._24_4_ = 0x3f800000;
      auVar114._28_4_ = 0x3f800000;
      auVar151._8_4_ = 0xbf800000;
      auVar151._0_8_ = 0xbf800000bf800000;
      auVar151._12_4_ = 0xbf800000;
      auVar151._16_4_ = 0xbf800000;
      auVar151._20_4_ = 0xbf800000;
      auVar151._24_4_ = 0xbf800000;
      auVar151._28_4_ = 0xbf800000;
      _local_2520 = vblendvps_avx(auVar114,auVar151,local_2500);
      local_2928 = context;
      local_2930 = ray;
      local_2620 = auVar124._0_4_;
      fStack_261c = auVar124._0_4_;
      fStack_2618 = auVar124._0_4_;
      fStack_2614 = auVar124._0_4_;
      fStack_2610 = auVar124._0_4_;
      fStack_260c = auVar124._0_4_;
      fStack_2608 = auVar124._0_4_;
      fStack_2604 = auVar124._0_4_;
      fVar169 = auVar124._0_4_;
      fVar171 = auVar124._0_4_;
      fVar173 = auVar124._0_4_;
      fVar175 = auVar124._0_4_;
      fVar177 = auVar124._0_4_;
      fVar179 = auVar124._0_4_;
      do {
        do {
          do {
            if (local_2a20 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar78 = local_2a20 + -1;
            local_2a20 = local_2a20 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar78 + 8));
          uVar77 = *(ulong *)*local_2a20;
          do {
            if ((uVar77 & 8) == 0) {
              uVar75 = uVar77 & 0xfffffffffffffff0;
              uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar95._4_4_ = uVar1;
              auVar95._0_4_ = uVar1;
              auVar95._8_4_ = uVar1;
              auVar95._12_4_ = uVar1;
              auVar95._16_4_ = uVar1;
              auVar95._20_4_ = uVar1;
              auVar95._24_4_ = uVar1;
              auVar95._28_4_ = uVar1;
              auVar89 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar75 + 0x100 + local_2948),auVar95,
                                        *(undefined1 (*) [32])(uVar75 + 0x40 + local_2948));
              auVar151 = vsubps_avx(ZEXT1632(auVar89),auVar160._0_32_);
              auVar31._4_4_ = fVar169 * auVar151._4_4_;
              auVar31._0_4_ = auVar124._0_4_ * auVar151._0_4_;
              auVar31._8_4_ = fVar171 * auVar151._8_4_;
              auVar31._12_4_ = fVar173 * auVar151._12_4_;
              auVar31._16_4_ = fVar175 * auVar151._16_4_;
              auVar31._20_4_ = fVar177 * auVar151._20_4_;
              auVar31._24_4_ = fVar179 * auVar151._24_4_;
              auVar31._28_4_ = auVar151._28_4_;
              auVar89 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar75 + 0x100 + local_2950),auVar95,
                                        *(undefined1 (*) [32])(uVar75 + 0x40 + local_2950));
              auVar151 = vsubps_avx(ZEXT1632(auVar89),auVar144._0_32_);
              auVar89 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar75 + 0x100 + local_2958),auVar95,
                                        *(undefined1 (*) [32])(uVar75 + 0x40 + local_2958));
              auVar152._4_4_ = auVar165._4_4_ * auVar151._4_4_;
              auVar152._0_4_ = auVar165._0_4_ * auVar151._0_4_;
              auVar152._8_4_ = auVar165._8_4_ * auVar151._8_4_;
              auVar152._12_4_ = auVar165._12_4_ * auVar151._12_4_;
              auVar152._16_4_ = auVar165._16_4_ * auVar151._16_4_;
              auVar152._20_4_ = auVar165._20_4_ * auVar151._20_4_;
              auVar152._24_4_ = auVar165._24_4_ * auVar151._24_4_;
              auVar152._28_4_ = auVar151._28_4_;
              auVar70._4_4_ = uStack_255c;
              auVar70._0_4_ = local_2560;
              auVar70._8_4_ = uStack_2558;
              auVar70._12_4_ = uStack_2554;
              auVar70._16_4_ = uStack_2550;
              auVar70._20_4_ = uStack_254c;
              auVar70._24_4_ = uStack_2548;
              auVar70._28_4_ = uStack_2544;
              auVar151 = vsubps_avx(ZEXT1632(auVar89),auVar70);
              auVar27._4_4_ = auVar151._4_4_ * local_2580._4_4_;
              auVar27._0_4_ = auVar151._0_4_ * (float)local_2580;
              auVar27._8_4_ = auVar151._8_4_ * (float)uStack_2578;
              auVar27._12_4_ = auVar151._12_4_ * uStack_2578._4_4_;
              auVar27._16_4_ = auVar151._16_4_ * (float)uStack_2570;
              auVar27._20_4_ = auVar151._20_4_ * uStack_2570._4_4_;
              auVar27._24_4_ = auVar151._24_4_ * (float)uStack_2568;
              auVar27._28_4_ = auVar151._28_4_;
              auVar151 = vmaxps_avx(auVar152,auVar27);
              auVar68._4_4_ = uStack_25fc;
              auVar68._0_4_ = local_2600;
              auVar68._8_4_ = uStack_25f8;
              auVar68._12_4_ = uStack_25f4;
              auVar68._16_4_ = uStack_25f0;
              auVar68._20_4_ = uStack_25ec;
              auVar68._24_4_ = uStack_25e8;
              auVar68._28_4_ = uStack_25e4;
              auVar114 = vmaxps_avx(auVar68,auVar31);
              auVar89 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar75 + 0x100 + local_2960),auVar95,
                                        *(undefined1 (*) [32])(uVar75 + 0x40 + local_2960));
              _local_27a0 = vmaxps_avx(auVar114,auVar151);
              auVar151 = vsubps_avx(ZEXT1632(auVar89),auVar160._0_32_);
              auVar28._4_4_ = auVar151._4_4_ * fStack_259c;
              auVar28._0_4_ = auVar151._0_4_ * local_25a0;
              auVar28._8_4_ = auVar151._8_4_ * fStack_2598;
              auVar28._12_4_ = auVar151._12_4_ * fStack_2594;
              auVar28._16_4_ = auVar151._16_4_ * fStack_2590;
              auVar28._20_4_ = auVar151._20_4_ * fStack_258c;
              auVar28._24_4_ = auVar151._24_4_ * fStack_2588;
              auVar28._28_4_ = auVar151._28_4_;
              auVar89 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar75 + 0x100 + local_2968),auVar95,
                                        *(undefined1 (*) [32])(uVar75 + 0x40 + local_2968));
              auVar151 = vsubps_avx(ZEXT1632(auVar89),auVar144._0_32_);
              auVar29._4_4_ = auVar151._4_4_ * local_25c0._4_4_;
              auVar29._0_4_ = auVar151._0_4_ * (float)local_25c0;
              auVar29._8_4_ = auVar151._8_4_ * (float)uStack_25b8;
              auVar29._12_4_ = auVar151._12_4_ * uStack_25b8._4_4_;
              auVar29._16_4_ = auVar151._16_4_ * (float)uStack_25b0;
              auVar29._20_4_ = auVar151._20_4_ * uStack_25b0._4_4_;
              auVar29._24_4_ = auVar151._24_4_ * (float)uStack_25a8;
              auVar29._28_4_ = auVar151._28_4_;
              auVar89 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar75 + 0x100 + local_2970),auVar95,
                                        *(undefined1 (*) [32])(uVar75 + 0x40 + local_2970));
              auVar151 = vsubps_avx(ZEXT1632(auVar89),auVar70);
              auVar159._4_4_ = auVar151._4_4_ * local_25e0._4_4_;
              auVar159._0_4_ = auVar151._0_4_ * (float)local_25e0;
              auVar159._8_4_ = auVar151._8_4_ * (float)uStack_25d8;
              auVar159._12_4_ = auVar151._12_4_ * uStack_25d8._4_4_;
              auVar159._16_4_ = auVar151._16_4_ * (float)uStack_25d0;
              auVar159._20_4_ = auVar151._20_4_ * uStack_25d0._4_4_;
              auVar159._24_4_ = auVar151._24_4_ * (float)uStack_25c8;
              auVar159._28_4_ = auVar151._28_4_;
              auVar151 = vminps_avx(auVar29,auVar159);
              auVar200._4_4_ = fStack_283c;
              auVar200._0_4_ = local_2840;
              auVar200._8_4_ = fStack_2838;
              auVar200._12_4_ = fStack_2834;
              auVar200._16_4_ = fStack_2830;
              auVar200._20_4_ = fStack_282c;
              auVar200._24_4_ = fStack_2828;
              auVar200._28_4_ = fStack_2824;
              auVar114 = vminps_avx(auVar200,auVar28);
              auVar151 = vminps_avx(auVar114,auVar151);
              auVar151 = vcmpps_avx(_local_27a0,auVar151,2);
              if (((uint)uVar77 & 7) == 6) {
                auVar114 = vcmpps_avx(*(undefined1 (*) [32])(uVar75 + 0x1c0),auVar95,2);
                auVar31 = vcmpps_avx(auVar95,*(undefined1 (*) [32])(uVar75 + 0x1e0),1);
                auVar114 = vandps_avx(auVar114,auVar31);
                auVar151 = vandps_avx(auVar114,auVar151);
                auVar89 = vpackssdw_avx(auVar151._0_16_,auVar151._16_16_);
              }
              else {
                auVar89 = vpackssdw_avx(auVar151._0_16_,auVar151._16_16_);
              }
              auVar89 = vpsllw_avx(auVar89,0xf);
              auVar89 = vpacksswb_avx(auVar89,auVar89);
              local_2938 = (ulong)(byte)(SUB161(auVar89 >> 7,0) & 1 |
                                         (SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                                         (SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                                         (SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                                         (SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                                         (SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                                         (SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                                        SUB161(auVar89 >> 0x3f,0) << 7);
            }
            if ((uVar77 & 8) == 0) {
              if (local_2938 == 0) {
                iVar73 = 4;
              }
              else {
                uVar75 = uVar77 & 0xfffffffffffffff0;
                lVar82 = 0;
                for (uVar77 = local_2938; (uVar77 & 1) == 0;
                    uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                  lVar82 = lVar82 + 1;
                }
                iVar73 = 0;
                uVar84 = local_2938 - 1 & local_2938;
                uVar77 = *(ulong *)(uVar75 + lVar82 * 8);
                if (uVar84 != 0) {
                  uVar15 = *(uint *)(local_27a0 + lVar82 * 4);
                  lVar82 = 0;
                  for (uVar88 = uVar84; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000
                      ) {
                    lVar82 = lVar82 + 1;
                  }
                  uVar84 = uVar84 - 1 & uVar84;
                  uVar88 = *(ulong *)(uVar75 + lVar82 * 8);
                  uVar81 = *(uint *)(local_27a0 + lVar82 * 4);
                  if (uVar84 == 0) {
                    if (uVar15 < uVar81) {
                      *(ulong *)*local_2a20 = uVar88;
                      *(uint *)(*local_2a20 + 8) = uVar81;
                      local_2a20 = local_2a20 + 1;
                    }
                    else {
                      *(ulong *)*local_2a20 = uVar77;
                      *(uint *)(*local_2a20 + 8) = uVar15;
                      uVar77 = uVar88;
                      local_2a20 = local_2a20 + 1;
                    }
                  }
                  else {
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = uVar77;
                    auVar89 = vpunpcklqdq_avx(auVar90,ZEXT416(uVar15));
                    auVar101._8_8_ = 0;
                    auVar101._0_8_ = uVar88;
                    auVar129 = vpunpcklqdq_avx(auVar101,ZEXT416(uVar81));
                    lVar82 = 0;
                    for (uVar77 = uVar84; (uVar77 & 1) == 0;
                        uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                      lVar82 = lVar82 + 1;
                    }
                    uVar84 = uVar84 - 1 & uVar84;
                    auVar112._8_8_ = 0;
                    auVar112._0_8_ = *(ulong *)(uVar75 + lVar82 * 8);
                    auVar90 = vpunpcklqdq_avx(auVar112,ZEXT416(*(uint *)(local_27a0 + lVar82 * 4)));
                    if (uVar84 == 0) {
                      auVar101 = vpcmpgtd_avx(auVar129,auVar89);
                      auVar130 = vpshufd_avx(auVar101,0xaa);
                      auVar101 = vblendvps_avx(auVar129,auVar89,auVar130);
                      auVar89 = vblendvps_avx(auVar89,auVar129,auVar130);
                      auVar129 = vpcmpgtd_avx(auVar90,auVar101);
                      auVar130 = vpshufd_avx(auVar129,0xaa);
                      auVar129 = vblendvps_avx(auVar90,auVar101,auVar130);
                      auVar90 = vblendvps_avx(auVar101,auVar90,auVar130);
                      auVar101 = vpcmpgtd_avx(auVar90,auVar89);
                      auVar130 = vpshufd_avx(auVar101,0xaa);
                      auVar101 = vblendvps_avx(auVar90,auVar89,auVar130);
                      auVar89 = vblendvps_avx(auVar89,auVar90,auVar130);
                      *local_2a20 = auVar89;
                      local_2a20[1] = auVar101;
                      uVar77 = auVar129._0_8_;
                      local_2a20 = local_2a20 + 2;
                    }
                    else {
                      lVar82 = 0;
                      for (uVar77 = uVar84; (uVar77 & 1) == 0;
                          uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                        lVar82 = lVar82 + 1;
                      }
                      uVar84 = uVar84 - 1 & uVar84;
                      auVar125._8_8_ = 0;
                      auVar125._0_8_ = *(ulong *)(uVar75 + lVar82 * 8);
                      auVar101 = vpunpcklqdq_avx(auVar125,ZEXT416(*(uint *)(local_27a0 + lVar82 * 4)
                                                                 ));
                      if (uVar84 == 0) {
                        auVar130 = vpcmpgtd_avx(auVar129,auVar89);
                        auVar111 = vpshufd_avx(auVar130,0xaa);
                        auVar130 = vblendvps_avx(auVar129,auVar89,auVar111);
                        auVar89 = vblendvps_avx(auVar89,auVar129,auVar111);
                        auVar129 = vpcmpgtd_avx(auVar101,auVar90);
                        auVar111 = vpshufd_avx(auVar129,0xaa);
                        auVar129 = vblendvps_avx(auVar101,auVar90,auVar111);
                        auVar90 = vblendvps_avx(auVar90,auVar101,auVar111);
                        auVar101 = vpcmpgtd_avx(auVar90,auVar89);
                        auVar111 = vpshufd_avx(auVar101,0xaa);
                        auVar101 = vblendvps_avx(auVar90,auVar89,auVar111);
                        auVar89 = vblendvps_avx(auVar89,auVar90,auVar111);
                        auVar90 = vpcmpgtd_avx(auVar129,auVar130);
                        auVar111 = vpshufd_avx(auVar90,0xaa);
                        auVar90 = vblendvps_avx(auVar129,auVar130,auVar111);
                        auVar129 = vblendvps_avx(auVar130,auVar129,auVar111);
                        auVar130 = vpcmpgtd_avx(auVar101,auVar129);
                        auVar111 = vpshufd_avx(auVar130,0xaa);
                        auVar130 = vblendvps_avx(auVar101,auVar129,auVar111);
                        auVar129 = vblendvps_avx(auVar129,auVar101,auVar111);
                        *local_2a20 = auVar89;
                        local_2a20[1] = auVar129;
                        local_2a20[2] = auVar130;
                        uVar77 = auVar90._0_8_;
                        pauVar78 = local_2a20 + 3;
                      }
                      else {
                        *local_2a20 = auVar89;
                        local_2a20[1] = auVar129;
                        local_2a20[2] = auVar90;
                        local_2a20[3] = auVar101;
                        lVar82 = 0x30;
                        do {
                          lVar85 = lVar82;
                          lVar82 = 0;
                          for (uVar77 = uVar84; (uVar77 & 1) == 0;
                              uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                            lVar82 = lVar82 + 1;
                          }
                          auVar91._8_8_ = 0;
                          auVar91._0_8_ = *(ulong *)(uVar75 + lVar82 * 8);
                          auVar89 = vpunpcklqdq_avx(auVar91,ZEXT416(*(uint *)(local_27a0 +
                                                                             lVar82 * 4)));
                          *(undefined1 (*) [16])(local_2a20[1] + lVar85) = auVar89;
                          uVar84 = uVar84 - 1 & uVar84;
                          lVar82 = lVar85 + 0x10;
                        } while (uVar84 != 0);
                        pauVar78 = (undefined1 (*) [16])(local_2a20[1] + lVar85);
                        if (lVar85 + 0x10 != 0) {
                          lVar82 = 0x10;
                          pauVar83 = local_2a20;
                          do {
                            auVar89 = pauVar83[1];
                            uVar15 = *(uint *)(pauVar83[1] + 8);
                            pauVar83 = pauVar83 + 1;
                            lVar85 = lVar82;
                            do {
                              if (uVar15 <= *(uint *)(local_2a20[-1] + lVar85 + 8)) {
                                pauVar86 = (undefined1 (*) [16])(*local_2a20 + lVar85);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_2a20 + lVar85) =
                                   *(undefined1 (*) [16])(local_2a20[-1] + lVar85);
                              lVar85 = lVar85 + -0x10;
                              pauVar86 = local_2a20;
                            } while (lVar85 != 0);
                            *pauVar86 = auVar89;
                            lVar82 = lVar82 + 0x10;
                          } while (pauVar78 != pauVar83);
                        }
                        uVar77 = *(ulong *)*pauVar78;
                      }
                      auVar160 = ZEXT3264(local_2860);
                      auVar144 = ZEXT3264(local_2880);
                      local_2a20 = pauVar78;
                    }
                  }
                }
              }
            }
            else {
              iVar73 = 6;
            }
          } while (iVar73 == 0);
        } while (iVar73 != 6);
        local_2978 = (ulong)((uint)uVar77 & 0xf) - 8;
        if (local_2978 != 0) {
          local_2940 = 0;
          local_29f0 = uVar77 & 0xfffffffffffffff0;
          do {
            local_2a10 = local_2940 * 0xe0;
            local_29c0 = (ray->super_RayK<1>).dir.field_0.m128[3] -
                         *(float *)(local_29f0 + 0xd0 + local_2a10);
            uVar77 = *(ulong *)(local_29f0 + 0x40 + local_2a10);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = uVar77;
            auVar151 = vpmovzxbd_avx2(auVar92);
            uVar1 = *(undefined4 *)(local_29f0 + 0x7c + local_2a10);
            auVar146._4_4_ = uVar1;
            auVar146._0_4_ = uVar1;
            auVar146._8_4_ = uVar1;
            auVar146._12_4_ = uVar1;
            auVar146._16_4_ = uVar1;
            auVar146._20_4_ = uVar1;
            auVar146._24_4_ = uVar1;
            auVar146._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_29f0 + 0x70 + local_2a10);
            auVar153._4_4_ = uVar1;
            auVar153._0_4_ = uVar1;
            auVar153._8_4_ = uVar1;
            auVar153._12_4_ = uVar1;
            auVar153._16_4_ = uVar1;
            auVar153._20_4_ = uVar1;
            auVar153._24_4_ = uVar1;
            auVar153._28_4_ = uVar1;
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar89 = vfmadd213ps_fma(auVar151,auVar146,auVar153);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(local_29f0 + 0x88 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar3);
            uVar1 = *(undefined4 *)(local_29f0 + 0xc4 + local_2a10);
            auVar161._4_4_ = uVar1;
            auVar161._0_4_ = uVar1;
            auVar161._8_4_ = uVar1;
            auVar161._12_4_ = uVar1;
            auVar161._16_4_ = uVar1;
            auVar161._20_4_ = uVar1;
            auVar161._24_4_ = uVar1;
            auVar161._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_29f0 + 0xb8 + local_2a10);
            auVar167._4_4_ = uVar1;
            auVar167._0_4_ = uVar1;
            auVar167._8_4_ = uVar1;
            auVar167._12_4_ = uVar1;
            auVar167._16_4_ = uVar1;
            auVar167._20_4_ = uVar1;
            auVar167._24_4_ = uVar1;
            auVar167._28_4_ = uVar1;
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar129 = vfmadd213ps_fma(auVar151,auVar161,auVar167);
            auVar102._8_8_ = 0;
            auVar102._0_8_ = *(ulong *)(local_29f0 + 0x48 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar102);
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar90 = vfmadd213ps_fma(auVar151,auVar146,auVar153);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(local_29f0 + 0x90 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar4);
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar101 = vfmadd213ps_fma(auVar151,auVar161,auVar167);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_29f0 + 0x50 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar5);
            auVar151 = vcvtdq2ps_avx(auVar151);
            uVar1 = *(undefined4 *)(local_29f0 + 0x80 + local_2a10);
            auVar181._4_4_ = uVar1;
            auVar181._0_4_ = uVar1;
            auVar181._8_4_ = uVar1;
            auVar181._12_4_ = uVar1;
            auVar181._16_4_ = uVar1;
            auVar181._20_4_ = uVar1;
            auVar181._24_4_ = uVar1;
            auVar181._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_29f0 + 0x74 + local_2a10);
            auVar185._4_4_ = uVar1;
            auVar185._0_4_ = uVar1;
            auVar185._8_4_ = uVar1;
            auVar185._12_4_ = uVar1;
            auVar185._16_4_ = uVar1;
            auVar185._20_4_ = uVar1;
            auVar185._24_4_ = uVar1;
            auVar185._28_4_ = uVar1;
            auVar130 = vfmadd213ps_fma(auVar151,auVar181,auVar185);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(local_29f0 + 0x98 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar6);
            auVar151 = vcvtdq2ps_avx(auVar151);
            uVar1 = *(undefined4 *)(local_29f0 + 200 + local_2a10);
            auVar186._4_4_ = uVar1;
            auVar186._0_4_ = uVar1;
            auVar186._8_4_ = uVar1;
            auVar186._12_4_ = uVar1;
            auVar186._16_4_ = uVar1;
            auVar186._20_4_ = uVar1;
            auVar186._24_4_ = uVar1;
            auVar186._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_29f0 + 0xbc + local_2a10);
            auVar191._4_4_ = uVar1;
            auVar191._0_4_ = uVar1;
            auVar191._8_4_ = uVar1;
            auVar191._12_4_ = uVar1;
            auVar191._16_4_ = uVar1;
            auVar191._20_4_ = uVar1;
            auVar191._24_4_ = uVar1;
            auVar191._28_4_ = uVar1;
            auVar111 = vfmadd213ps_fma(auVar151,auVar186,auVar191);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(local_29f0 + 0x58 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar7);
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar124 = vfmadd213ps_fma(auVar151,auVar181,auVar185);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(local_29f0 + 0xa0 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar8);
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar131 = vfmadd213ps_fma(auVar151,auVar186,auVar191);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)(local_29f0 + 0x60 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar9);
            auVar151 = vcvtdq2ps_avx(auVar151);
            uVar1 = *(undefined4 *)(local_29f0 + 0x84 + local_2a10);
            auVar187._4_4_ = uVar1;
            auVar187._0_4_ = uVar1;
            auVar187._8_4_ = uVar1;
            auVar187._12_4_ = uVar1;
            auVar187._16_4_ = uVar1;
            auVar187._20_4_ = uVar1;
            auVar187._24_4_ = uVar1;
            auVar187._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_29f0 + 0x78 + local_2a10);
            auVar192._4_4_ = uVar1;
            auVar192._0_4_ = uVar1;
            auVar192._8_4_ = uVar1;
            auVar192._12_4_ = uVar1;
            auVar192._16_4_ = uVar1;
            auVar192._20_4_ = uVar1;
            auVar192._24_4_ = uVar1;
            auVar192._28_4_ = uVar1;
            auVar112 = vfmadd213ps_fma(auVar151,auVar187,auVar192);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(local_29f0 + 0xa8 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar10);
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(local_29f0 + 0x68 + local_2a10);
            auVar114 = vpmovzxbd_avx2(auVar11);
            auVar114 = vcvtdq2ps_avx(auVar114);
            auVar125 = vfmadd213ps_fma(auVar114,auVar187,auVar192);
            uVar1 = *(undefined4 *)(local_29f0 + 0xcc + local_2a10);
            auVar188._4_4_ = uVar1;
            auVar188._0_4_ = uVar1;
            auVar188._8_4_ = uVar1;
            auVar188._12_4_ = uVar1;
            auVar188._16_4_ = uVar1;
            auVar188._20_4_ = uVar1;
            auVar188._24_4_ = uVar1;
            auVar188._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_29f0 + 0xc0 + local_2a10);
            auVar193._4_4_ = uVar1;
            auVar193._0_4_ = uVar1;
            auVar193._8_4_ = uVar1;
            auVar193._12_4_ = uVar1;
            auVar193._16_4_ = uVar1;
            auVar193._20_4_ = uVar1;
            auVar193._24_4_ = uVar1;
            auVar193._28_4_ = uVar1;
            auVar91 = vfmadd213ps_fma(auVar151,auVar188,auVar193);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(local_29f0 + 0xb0 + local_2a10);
            auVar151 = vpmovzxbd_avx2(auVar12);
            auVar151 = vcvtdq2ps_avx(auVar151);
            auVar3 = vfmadd213ps_fma(auVar151,auVar188,auVar193);
            local_29c0 = local_29c0 * *(float *)(local_29f0 + 0xd4 + local_2a10);
            auVar189._4_4_ = local_29c0;
            auVar189._0_4_ = local_29c0;
            auVar189._8_4_ = local_29c0;
            auVar189._12_4_ = local_29c0;
            auVar189._16_4_ = local_29c0;
            auVar189._20_4_ = local_29c0;
            auVar189._24_4_ = local_29c0;
            auVar189._28_4_ = local_29c0;
            auVar151 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar89));
            auVar4 = vfmadd213ps_fma(auVar151,auVar189,ZEXT1632(auVar89));
            auVar151 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar90));
            auVar90 = vfmadd213ps_fma(auVar151,auVar189,ZEXT1632(auVar90));
            auVar151 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar130));
            auVar101 = vfmadd213ps_fma(auVar151,auVar189,ZEXT1632(auVar130));
            auVar151 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar124));
            auVar130 = vfmadd213ps_fma(auVar151,auVar189,ZEXT1632(auVar124));
            auVar151 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar112));
            auVar111 = vfmadd213ps_fma(auVar151,auVar189,ZEXT1632(auVar112));
            auVar151 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar125));
            auVar124 = vfmadd213ps_fma(auVar151,auVar189,ZEXT1632(auVar125));
            auVar89 = vpminub_avx(auVar92,auVar102);
            auVar93._8_8_ = 0;
            auVar93._0_8_ = uVar77;
            auVar129 = vpcmpeqb_avx(auVar93,auVar89);
            auVar151 = vsubps_avx(ZEXT1632(auVar4),local_2860);
            auVar32._4_4_ = auVar151._4_4_ * fStack_261c;
            auVar32._0_4_ = auVar151._0_4_ * local_2620;
            auVar32._8_4_ = auVar151._8_4_ * fStack_2618;
            auVar32._12_4_ = auVar151._12_4_ * fStack_2614;
            auVar32._16_4_ = auVar151._16_4_ * fStack_2610;
            auVar32._20_4_ = auVar151._20_4_ * fStack_260c;
            auVar32._24_4_ = auVar151._24_4_ * fStack_2608;
            auVar32._28_4_ = auVar151._28_4_;
            auVar151 = vsubps_avx(ZEXT1632(auVar101),local_2880);
            auVar33._4_4_ = auVar151._4_4_ * (float)local_2640._4_4_;
            auVar33._0_4_ = auVar151._0_4_ * (float)local_2640._0_4_;
            auVar33._8_4_ = auVar151._8_4_ * fStack_2638;
            auVar33._12_4_ = auVar151._12_4_ * fStack_2634;
            auVar33._16_4_ = auVar151._16_4_ * fStack_2630;
            auVar33._20_4_ = auVar151._20_4_ * fStack_262c;
            auVar33._24_4_ = auVar151._24_4_ * fStack_2628;
            auVar33._28_4_ = auVar151._28_4_;
            auVar151 = vsubps_avx(ZEXT1632(auVar90),local_2860);
            auVar34._4_4_ = auVar151._4_4_ * fStack_259c;
            auVar34._0_4_ = auVar151._0_4_ * local_25a0;
            auVar34._8_4_ = auVar151._8_4_ * fStack_2598;
            auVar34._12_4_ = auVar151._12_4_ * fStack_2594;
            auVar34._16_4_ = auVar151._16_4_ * fStack_2590;
            auVar34._20_4_ = auVar151._20_4_ * fStack_258c;
            auVar34._24_4_ = auVar151._24_4_ * fStack_2588;
            auVar34._28_4_ = auVar151._28_4_;
            auVar151 = vsubps_avx(ZEXT1632(auVar130),local_2880);
            auVar35._4_4_ = auVar151._4_4_ * local_25c0._4_4_;
            auVar35._0_4_ = auVar151._0_4_ * (float)local_25c0;
            auVar35._8_4_ = auVar151._8_4_ * (float)uStack_25b8;
            auVar35._12_4_ = auVar151._12_4_ * uStack_25b8._4_4_;
            auVar35._16_4_ = auVar151._16_4_ * (float)uStack_25b0;
            auVar35._20_4_ = auVar151._20_4_ * uStack_25b0._4_4_;
            auVar35._24_4_ = auVar151._24_4_ * (float)uStack_25a8;
            auVar35._28_4_ = auVar151._28_4_;
            auVar151 = vpminsd_avx2(auVar32,auVar34);
            auVar114 = vpmaxsd_avx2(auVar32,auVar34);
            auVar31 = vpminsd_avx2(auVar33,auVar35);
            auVar31 = vpmaxsd_avx2(auVar151,auVar31);
            auVar152 = vpmaxsd_avx2(auVar33,auVar35);
            auVar71._4_4_ = uStack_255c;
            auVar71._0_4_ = local_2560;
            auVar71._8_4_ = uStack_2558;
            auVar71._12_4_ = uStack_2554;
            auVar71._16_4_ = uStack_2550;
            auVar71._20_4_ = uStack_254c;
            auVar71._24_4_ = uStack_2548;
            auVar71._28_4_ = uStack_2544;
            auVar151 = vsubps_avx(ZEXT1632(auVar111),auVar71);
            auVar36._4_4_ = auVar151._4_4_ * local_2580._4_4_;
            auVar36._0_4_ = auVar151._0_4_ * (float)local_2580;
            auVar36._8_4_ = auVar151._8_4_ * (float)uStack_2578;
            auVar36._12_4_ = auVar151._12_4_ * uStack_2578._4_4_;
            auVar36._16_4_ = auVar151._16_4_ * (float)uStack_2570;
            auVar36._20_4_ = auVar151._20_4_ * uStack_2570._4_4_;
            auVar36._24_4_ = auVar151._24_4_ * (float)uStack_2568;
            auVar36._28_4_ = auVar151._28_4_;
            auVar151 = vsubps_avx(ZEXT1632(auVar124),auVar71);
            auVar37._4_4_ = auVar151._4_4_ * local_25e0._4_4_;
            auVar37._0_4_ = auVar151._0_4_ * (float)local_25e0;
            auVar37._8_4_ = auVar151._8_4_ * (float)uStack_25d8;
            auVar37._12_4_ = auVar151._12_4_ * uStack_25d8._4_4_;
            auVar37._16_4_ = auVar151._16_4_ * (float)uStack_25d0;
            auVar37._20_4_ = auVar151._20_4_ * uStack_25d0._4_4_;
            auVar37._24_4_ = auVar151._24_4_ * (float)uStack_25c8;
            auVar37._28_4_ = auVar151._28_4_;
            auVar152 = vpminsd_avx2(auVar114,auVar152);
            auVar114 = vpminsd_avx2(auVar36,auVar37);
            auVar151 = vpmaxsd_avx2(auVar36,auVar37);
            auVar69._4_4_ = uStack_25fc;
            auVar69._0_4_ = local_2600;
            auVar69._8_4_ = uStack_25f8;
            auVar69._12_4_ = uStack_25f4;
            auVar69._16_4_ = uStack_25f0;
            auVar69._20_4_ = uStack_25ec;
            auVar69._24_4_ = uStack_25e8;
            auVar69._28_4_ = uStack_25e4;
            auVar114 = vpmaxsd_avx2(auVar114,auVar69);
            local_23c0 = vpmaxsd_avx2(auVar31,auVar114);
            auVar67._4_4_ = fStack_283c;
            auVar67._0_4_ = local_2840;
            auVar67._8_4_ = fStack_2838;
            auVar67._12_4_ = fStack_2834;
            auVar67._16_4_ = fStack_2830;
            auVar67._20_4_ = fStack_282c;
            auVar67._24_4_ = fStack_2828;
            auVar67._28_4_ = fStack_2824;
            auVar151 = vpminsd_avx2(auVar151,auVar67);
            auVar151 = vpminsd_avx2(auVar152,auVar151);
            auVar151 = vpcmpgtd_avx2(local_23c0,auVar151);
            auVar89 = vpackssdw_avx(SUB3216(auVar151 ^ _DAT_0205a980,0),
                                    SUB3216(auVar151 ^ _DAT_0205a980,0x10));
            auVar129 = vpmovzxbw_avx(auVar129);
            auVar89 = vpand_avx(auVar89,auVar129);
            auVar89 = vpshufb_avx(auVar89,_DAT_0205e3c0);
            bVar30 = SUB161(auVar89 >> 7,0) & 1 | (SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar89 >> 0x17,0) & 1) << 2 | (SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar89 >> 0x27,0) & 1) << 4 | (SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar89 >> 0x37,0) & 1) << 6 | SUB161(auVar89 >> 0x3f,0) << 7;
            if (bVar30 != 0) {
              local_2a10 = local_2a10 + local_29f0;
              local_2908 = (ulong)bVar30;
              do {
                pRVar72 = local_2930;
                lVar82 = 0;
                for (uVar77 = local_2908; (uVar77 & 1) == 0;
                    uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                  lVar82 = lVar82 + 1;
                }
                auVar124._0_4_ = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_23c0 + lVar82 * 4) <= auVar124._0_4_) {
                  local_27b0 = ZEXT416((uint)auVar124._0_4_);
                  uVar13 = *(ushort *)(local_2a10 + lVar82 * 8);
                  uVar14 = *(ushort *)(local_2a10 + 2 + lVar82 * 8);
                  uVar15 = *(uint *)(local_2a10 + 0xd8);
                  uVar75 = (ulong)uVar15;
                  uVar81 = *(uint *)(local_2a10 + 4 + lVar82 * 8);
                  local_2910 = context->scene;
                  pGVar17 = (local_2910->geometries).items[uVar75].ptr;
                  local_2918 = *(long *)&pGVar17->field_0x58;
                  local_29e8 = (ulong)uVar81;
                  local_2920 = pGVar17[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar81;
                  fVar169 = (pGVar17->time_range).lower;
                  fVar169 = pGVar17->fnumTimeSegments *
                            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar169) /
                            ((pGVar17->time_range).upper - fVar169));
                  auVar89 = vroundss_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),9);
                  auVar89 = vminss_avx(auVar89,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
                  auVar101 = vmaxss_avx(ZEXT816(0),auVar89);
                  local_29f8 = uVar13 & 0x7fff;
                  local_29fc = uVar14 & 0x7fff;
                  uVar16 = *(uint *)(local_2918 + 4 + local_2920);
                  uVar84 = (ulong)uVar16;
                  uVar88 = (ulong)(uVar16 * local_29fc +
                                  *(int *)(local_2918 + local_2920) + local_29f8);
                  lVar85 = *(long *)&pGVar17[2].numPrimitives;
                  lVar79 = (long)(int)auVar101._0_4_ * 0x38;
                  lVar18 = *(long *)(lVar85 + 0x10 + lVar79);
                  lVar19 = *(long *)(lVar85 + lVar79);
                  auVar89 = *(undefined1 (*) [16])(lVar19 + lVar18 * uVar88);
                  lVar20 = *(long *)(lVar85 + 0x48 + lVar79);
                  auVar129 = *(undefined1 (*) [16])(lVar19 + (uVar88 + 1) * lVar18);
                  lVar82 = uVar88 + uVar84;
                  auVar90 = *(undefined1 (*) [16])(lVar19 + lVar82 * lVar18);
                  lVar87 = uVar88 + uVar84 + 1;
                  auVar130 = *(undefined1 (*) [16])(lVar19 + lVar87 * lVar18);
                  lVar76 = uVar88 + (-1 < (short)uVar13) + 1;
                  auVar111 = *(undefined1 (*) [16])(lVar19 + lVar76 * lVar18);
                  lVar80 = (ulong)(-1 < (short)uVar13) + lVar87;
                  uVar77 = 0;
                  if (-1 < (short)uVar14) {
                    uVar77 = uVar84;
                  }
                  auVar131 = *(undefined1 (*) [16])(lVar19 + lVar80 * lVar18);
                  auVar112 = *(undefined1 (*) [16])(lVar19 + (lVar82 + uVar77) * lVar18);
                  auVar125 = *(undefined1 (*) [16])(lVar19 + (lVar87 + uVar77) * lVar18);
                  auVar91 = *(undefined1 (*) [16])(lVar19 + lVar18 * (uVar77 + lVar80));
                  lVar85 = *(long *)(lVar85 + 0x38 + lVar79);
                  fVar169 = fVar169 - auVar101._0_4_;
                  auVar94._4_4_ = fVar169;
                  auVar94._0_4_ = fVar169;
                  auVar94._8_4_ = fVar169;
                  auVar94._12_4_ = fVar169;
                  auVar101 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * uVar88),auVar89);
                  auVar3 = vfmadd213ps_fma(auVar101,auVar94,auVar89);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * (uVar88 + 1)),
                                       auVar129);
                  auVar4 = vfmadd213ps_fma(auVar89,auVar94,auVar129);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * lVar82),auVar90);
                  auVar5 = vfmadd213ps_fma(auVar89,auVar94,auVar90);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * lVar87),auVar130);
                  auVar6 = vfmadd213ps_fma(auVar89,auVar94,auVar130);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * lVar76),auVar111);
                  auVar129 = vfmadd213ps_fma(auVar89,auVar94,auVar111);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * lVar80),auVar131);
                  auVar7 = vfmadd213ps_fma(auVar89,auVar94,auVar131);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * (lVar82 + uVar77)),
                                       auVar112);
                  auVar112 = vfmadd213ps_fma(auVar89,auVar94,auVar112);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + lVar20 * (lVar87 + uVar77)),
                                       auVar125);
                  auVar125 = vfmadd213ps_fma(auVar89,auVar94,auVar125);
                  auVar89 = vsubps_avx(*(undefined1 (*) [16])(lVar85 + (uVar77 + lVar80) * lVar20),
                                       auVar91);
                  auVar91 = vfmadd213ps_fma(auVar89,auVar94,auVar91);
                  auVar90 = vunpcklps_avx(auVar4,auVar7);
                  auVar89 = vunpckhps_avx(auVar4,auVar7);
                  auVar101 = vunpcklps_avx(auVar129,auVar6);
                  auVar129 = vunpckhps_avx(auVar129,auVar6);
                  auVar130 = vunpcklps_avx(auVar89,auVar129);
                  auVar111 = vunpcklps_avx(auVar90,auVar101);
                  auVar89 = vunpckhps_avx(auVar90,auVar101);
                  auVar101 = vunpcklps_avx(auVar5,auVar125);
                  auVar129 = vunpckhps_avx(auVar5,auVar125);
                  auVar131 = vunpcklps_avx(auVar6,auVar112);
                  auVar90 = vunpckhps_avx(auVar6,auVar112);
                  auVar90 = vunpcklps_avx(auVar129,auVar90);
                  auVar112 = vunpcklps_avx(auVar101,auVar131);
                  auVar129 = vunpckhps_avx(auVar101,auVar131);
                  auVar154._16_16_ = auVar125;
                  auVar154._0_16_ = auVar5;
                  auVar115._16_16_ = auVar7;
                  auVar115._0_16_ = auVar4;
                  auVar151 = vunpcklps_avx(auVar115,auVar154);
                  auVar132._16_16_ = auVar91;
                  auVar132._0_16_ = auVar6;
                  auVar103._16_16_ = auVar6;
                  auVar103._0_16_ = auVar3;
                  auVar114 = vunpcklps_avx(auVar103,auVar132);
                  auVar152 = vunpcklps_avx(auVar114,auVar151);
                  auVar151 = vunpckhps_avx(auVar114,auVar151);
                  auVar114 = vunpckhps_avx(auVar115,auVar154);
                  auVar31 = vunpckhps_avx(auVar103,auVar132);
                  auVar114 = vunpcklps_avx(auVar31,auVar114);
                  auVar116._16_16_ = auVar111;
                  auVar116._0_16_ = auVar111;
                  auVar96._16_16_ = auVar89;
                  auVar96._0_16_ = auVar89;
                  auVar133._16_16_ = auVar130;
                  auVar133._0_16_ = auVar130;
                  auVar140._16_16_ = auVar112;
                  auVar140._0_16_ = auVar112;
                  auVar155._16_16_ = auVar129;
                  auVar155._0_16_ = auVar129;
                  auVar147._16_16_ = auVar90;
                  auVar147._0_16_ = auVar90;
                  uVar1 = *(undefined4 *)&(local_2930->super_RayK<1>).org.field_0;
                  auVar162._4_4_ = uVar1;
                  auVar162._0_4_ = uVar1;
                  auVar162._8_4_ = uVar1;
                  auVar162._12_4_ = uVar1;
                  auVar162._16_4_ = uVar1;
                  auVar162._20_4_ = uVar1;
                  auVar162._24_4_ = uVar1;
                  auVar162._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)((long)&(local_2930->super_RayK<1>).org.field_0 + 4);
                  auVar168._4_4_ = uVar1;
                  auVar168._0_4_ = uVar1;
                  auVar168._8_4_ = uVar1;
                  auVar168._12_4_ = uVar1;
                  auVar168._16_4_ = uVar1;
                  auVar168._20_4_ = uVar1;
                  auVar168._24_4_ = uVar1;
                  auVar168._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)((long)&(local_2930->super_RayK<1>).org.field_0 + 8);
                  auVar182._4_4_ = uVar1;
                  auVar182._0_4_ = uVar1;
                  auVar182._8_4_ = uVar1;
                  auVar182._12_4_ = uVar1;
                  auVar182._16_4_ = uVar1;
                  auVar182._20_4_ = uVar1;
                  auVar182._24_4_ = uVar1;
                  auVar182._28_4_ = uVar1;
                  local_2800 = vsubps_avx(auVar152,auVar162);
                  local_2820 = vsubps_avx(auVar151,auVar168);
                  local_28a0 = vsubps_avx(auVar114,auVar182);
                  auVar151 = vsubps_avx(auVar116,auVar162);
                  auVar114 = vsubps_avx(auVar96,auVar168);
                  auVar31 = vsubps_avx(auVar133,auVar182);
                  auVar152 = vsubps_avx(auVar140,auVar162);
                  auVar27 = vsubps_avx(auVar155,auVar168);
                  auVar28 = vsubps_avx(auVar147,auVar182);
                  local_23e0 = vsubps_avx(auVar152,local_2800);
                  local_2420 = vsubps_avx(auVar27,local_2820);
                  local_2400 = vsubps_avx(auVar28,local_28a0);
                  auVar97._0_4_ = local_2800._0_4_ + auVar152._0_4_;
                  auVar97._4_4_ = local_2800._4_4_ + auVar152._4_4_;
                  auVar97._8_4_ = local_2800._8_4_ + auVar152._8_4_;
                  auVar97._12_4_ = local_2800._12_4_ + auVar152._12_4_;
                  auVar97._16_4_ = local_2800._16_4_ + auVar152._16_4_;
                  auVar97._20_4_ = local_2800._20_4_ + auVar152._20_4_;
                  auVar97._24_4_ = local_2800._24_4_ + auVar152._24_4_;
                  auVar97._28_4_ = local_2800._28_4_ + auVar152._28_4_;
                  auVar126._0_4_ = auVar27._0_4_ + local_2820._0_4_;
                  auVar126._4_4_ = auVar27._4_4_ + local_2820._4_4_;
                  auVar126._8_4_ = auVar27._8_4_ + local_2820._8_4_;
                  auVar126._12_4_ = auVar27._12_4_ + local_2820._12_4_;
                  auVar126._16_4_ = auVar27._16_4_ + local_2820._16_4_;
                  auVar126._20_4_ = auVar27._20_4_ + local_2820._20_4_;
                  auVar126._24_4_ = auVar27._24_4_ + local_2820._24_4_;
                  auVar126._28_4_ = auVar27._28_4_ + local_2820._28_4_;
                  fVar169 = local_28a0._0_4_;
                  auVar148._0_4_ = auVar28._0_4_ + fVar169;
                  fVar171 = local_28a0._4_4_;
                  auVar148._4_4_ = auVar28._4_4_ + fVar171;
                  fVar173 = local_28a0._8_4_;
                  auVar148._8_4_ = auVar28._8_4_ + fVar173;
                  fVar175 = local_28a0._12_4_;
                  auVar148._12_4_ = auVar28._12_4_ + fVar175;
                  fVar177 = local_28a0._16_4_;
                  auVar148._16_4_ = auVar28._16_4_ + fVar177;
                  fVar179 = local_28a0._20_4_;
                  auVar148._20_4_ = auVar28._20_4_ + fVar179;
                  fVar23 = local_28a0._24_4_;
                  auVar148._24_4_ = auVar28._24_4_ + fVar23;
                  auVar148._28_4_ = auVar28._28_4_ + local_28a0._28_4_;
                  auVar38._4_4_ = local_2400._4_4_ * auVar126._4_4_;
                  auVar38._0_4_ = local_2400._0_4_ * auVar126._0_4_;
                  auVar38._8_4_ = local_2400._8_4_ * auVar126._8_4_;
                  auVar38._12_4_ = local_2400._12_4_ * auVar126._12_4_;
                  auVar38._16_4_ = local_2400._16_4_ * auVar126._16_4_;
                  auVar38._20_4_ = local_2400._20_4_ * auVar126._20_4_;
                  auVar38._24_4_ = local_2400._24_4_ * auVar126._24_4_;
                  auVar38._28_4_ = auVar129._12_4_;
                  auVar129 = vfmsub231ps_fma(auVar38,local_2420,auVar148);
                  auVar39._4_4_ = local_23e0._4_4_ * auVar148._4_4_;
                  auVar39._0_4_ = local_23e0._0_4_ * auVar148._0_4_;
                  auVar39._8_4_ = local_23e0._8_4_ * auVar148._8_4_;
                  auVar39._12_4_ = local_23e0._12_4_ * auVar148._12_4_;
                  auVar39._16_4_ = local_23e0._16_4_ * auVar148._16_4_;
                  auVar39._20_4_ = local_23e0._20_4_ * auVar148._20_4_;
                  auVar39._24_4_ = local_23e0._24_4_ * auVar148._24_4_;
                  auVar39._28_4_ = auVar148._28_4_;
                  auVar89 = vfmsub231ps_fma(auVar39,local_2400,auVar97);
                  auVar40._4_4_ = local_2420._4_4_ * auVar97._4_4_;
                  auVar40._0_4_ = local_2420._0_4_ * auVar97._0_4_;
                  auVar40._8_4_ = local_2420._8_4_ * auVar97._8_4_;
                  auVar40._12_4_ = local_2420._12_4_ * auVar97._12_4_;
                  auVar40._16_4_ = local_2420._16_4_ * auVar97._16_4_;
                  auVar40._20_4_ = local_2420._20_4_ * auVar97._20_4_;
                  auVar40._24_4_ = local_2420._24_4_ * auVar97._24_4_;
                  auVar40._28_4_ = auVar97._28_4_;
                  local_29c0 = (local_2930->super_RayK<1>).dir.field_0.m128[2];
                  fStack_29bc = local_29c0;
                  fStack_29b8 = local_29c0;
                  fStack_29b4 = local_29c0;
                  fStack_29b0 = local_29c0;
                  fStack_29ac = local_29c0;
                  fStack_29a8 = local_29c0;
                  fStack_29a4 = local_29c0;
                  auVar90 = vfmsub231ps_fma(auVar40,local_23e0,auVar126);
                  auVar41._4_4_ = local_29c0 * auVar90._4_4_;
                  auVar41._0_4_ = local_29c0 * auVar90._0_4_;
                  auVar41._8_4_ = local_29c0 * auVar90._8_4_;
                  auVar41._12_4_ = local_29c0 * auVar90._12_4_;
                  auVar41._16_4_ = local_29c0 * 0.0;
                  auVar41._20_4_ = local_29c0 * 0.0;
                  auVar41._24_4_ = local_29c0 * 0.0;
                  auVar41._28_4_ = local_2420._28_4_;
                  uVar1 = *(undefined4 *)((long)&(local_2930->super_RayK<1>).dir.field_0 + 4);
                  local_29a0._4_4_ = uVar1;
                  local_29a0._0_4_ = uVar1;
                  local_29a0._8_4_ = uVar1;
                  local_29a0._12_4_ = uVar1;
                  local_29a0._16_4_ = uVar1;
                  local_29a0._20_4_ = uVar1;
                  local_29a0._24_4_ = uVar1;
                  local_29a0._28_4_ = uVar1;
                  auVar89 = vfmadd231ps_fma(auVar41,local_29a0._0_32_,ZEXT1632(auVar89));
                  uVar1 = *(undefined4 *)&(local_2930->super_RayK<1>).dir.field_0;
                  local_29e0._4_4_ = uVar1;
                  local_29e0._0_4_ = uVar1;
                  local_29e0._8_4_ = uVar1;
                  local_29e0._12_4_ = uVar1;
                  local_29e0._16_4_ = uVar1;
                  local_29e0._20_4_ = uVar1;
                  local_29e0._24_4_ = uVar1;
                  local_29e0._28_4_ = uVar1;
                  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_29e0,ZEXT1632(auVar129));
                  local_2440 = vsubps_avx(local_2820,auVar114);
                  local_2480 = vsubps_avx(local_28a0,auVar31);
                  auVar149._0_4_ = local_2820._0_4_ + auVar114._0_4_;
                  auVar149._4_4_ = local_2820._4_4_ + auVar114._4_4_;
                  auVar149._8_4_ = local_2820._8_4_ + auVar114._8_4_;
                  auVar149._12_4_ = local_2820._12_4_ + auVar114._12_4_;
                  auVar149._16_4_ = local_2820._16_4_ + auVar114._16_4_;
                  auVar149._20_4_ = local_2820._20_4_ + auVar114._20_4_;
                  auVar149._24_4_ = local_2820._24_4_ + auVar114._24_4_;
                  auVar149._28_4_ = local_2820._28_4_ + auVar114._28_4_;
                  auVar156._0_4_ = auVar31._0_4_ + fVar169;
                  auVar156._4_4_ = auVar31._4_4_ + fVar171;
                  auVar156._8_4_ = auVar31._8_4_ + fVar173;
                  auVar156._12_4_ = auVar31._12_4_ + fVar175;
                  auVar156._16_4_ = auVar31._16_4_ + fVar177;
                  auVar156._20_4_ = auVar31._20_4_ + fVar179;
                  auVar156._24_4_ = auVar31._24_4_ + fVar23;
                  fVar100 = auVar31._28_4_;
                  auVar156._28_4_ = fVar100 + local_28a0._28_4_;
                  fVar110 = local_2480._0_4_;
                  fVar119 = local_2480._4_4_;
                  auVar42._4_4_ = auVar149._4_4_ * fVar119;
                  auVar42._0_4_ = auVar149._0_4_ * fVar110;
                  fVar121 = local_2480._8_4_;
                  auVar42._8_4_ = auVar149._8_4_ * fVar121;
                  fVar123 = local_2480._12_4_;
                  auVar42._12_4_ = auVar149._12_4_ * fVar123;
                  fVar137 = local_2480._16_4_;
                  auVar42._16_4_ = auVar149._16_4_ * fVar137;
                  fVar139 = local_2480._20_4_;
                  auVar42._20_4_ = auVar149._20_4_ * fVar139;
                  fVar25 = local_2480._24_4_;
                  auVar42._24_4_ = auVar149._24_4_ * fVar25;
                  auVar42._28_4_ = local_23e0._28_4_;
                  auVar90 = vfmsub231ps_fma(auVar42,local_2440,auVar156);
                  local_2460 = vsubps_avx(local_2800,auVar151);
                  fVar118 = local_2460._0_4_;
                  fVar120 = local_2460._4_4_;
                  auVar43._4_4_ = auVar156._4_4_ * fVar120;
                  auVar43._0_4_ = auVar156._0_4_ * fVar118;
                  fVar122 = local_2460._8_4_;
                  auVar43._8_4_ = auVar156._8_4_ * fVar122;
                  fVar127 = local_2460._12_4_;
                  auVar43._12_4_ = auVar156._12_4_ * fVar127;
                  fVar138 = local_2460._16_4_;
                  auVar43._16_4_ = auVar156._16_4_ * fVar138;
                  fVar24 = local_2460._20_4_;
                  auVar43._20_4_ = auVar156._20_4_ * fVar24;
                  fVar26 = local_2460._24_4_;
                  auVar43._24_4_ = auVar156._24_4_ * fVar26;
                  auVar43._28_4_ = local_2400._28_4_;
                  auVar157._0_4_ = local_2800._0_4_ + auVar151._0_4_;
                  auVar157._4_4_ = local_2800._4_4_ + auVar151._4_4_;
                  auVar157._8_4_ = local_2800._8_4_ + auVar151._8_4_;
                  auVar157._12_4_ = local_2800._12_4_ + auVar151._12_4_;
                  auVar157._16_4_ = local_2800._16_4_ + auVar151._16_4_;
                  auVar157._20_4_ = local_2800._20_4_ + auVar151._20_4_;
                  auVar157._24_4_ = local_2800._24_4_ + auVar151._24_4_;
                  auVar157._28_4_ = local_2800._28_4_ + auVar151._28_4_;
                  auVar129 = vfmsub231ps_fma(auVar43,local_2480,auVar157);
                  fVar190 = local_2440._0_4_;
                  fVar194 = local_2440._4_4_;
                  auVar44._4_4_ = fVar194 * auVar157._4_4_;
                  auVar44._0_4_ = fVar190 * auVar157._0_4_;
                  fVar195 = local_2440._8_4_;
                  auVar44._8_4_ = fVar195 * auVar157._8_4_;
                  fVar196 = local_2440._12_4_;
                  auVar44._12_4_ = fVar196 * auVar157._12_4_;
                  fVar197 = local_2440._16_4_;
                  auVar44._16_4_ = fVar197 * auVar157._16_4_;
                  fVar198 = local_2440._20_4_;
                  auVar44._20_4_ = fVar198 * auVar157._20_4_;
                  fVar199 = local_2440._24_4_;
                  auVar44._24_4_ = fVar199 * auVar157._24_4_;
                  auVar44._28_4_ = auVar157._28_4_;
                  auVar101 = vfmsub231ps_fma(auVar44,local_2460,auVar149);
                  auVar158._0_4_ = local_29c0 * auVar101._0_4_;
                  auVar158._4_4_ = local_29c0 * auVar101._4_4_;
                  auVar158._8_4_ = local_29c0 * auVar101._8_4_;
                  auVar158._12_4_ = local_29c0 * auVar101._12_4_;
                  auVar158._16_4_ = local_29c0 * 0.0;
                  auVar158._20_4_ = local_29c0 * 0.0;
                  auVar158._24_4_ = local_29c0 * 0.0;
                  auVar158._28_4_ = 0;
                  auVar129 = vfmadd231ps_fma(auVar158,local_29a0._0_32_,ZEXT1632(auVar129));
                  auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_29e0,ZEXT1632(auVar90));
                  auVar29 = vsubps_avx(auVar151,auVar152);
                  auVar141._0_4_ = auVar151._0_4_ + auVar152._0_4_;
                  auVar141._4_4_ = auVar151._4_4_ + auVar152._4_4_;
                  auVar141._8_4_ = auVar151._8_4_ + auVar152._8_4_;
                  auVar141._12_4_ = auVar151._12_4_ + auVar152._12_4_;
                  auVar141._16_4_ = auVar151._16_4_ + auVar152._16_4_;
                  auVar141._20_4_ = auVar151._20_4_ + auVar152._20_4_;
                  auVar141._24_4_ = auVar151._24_4_ + auVar152._24_4_;
                  auVar141._28_4_ = auVar151._28_4_ + auVar152._28_4_;
                  auVar152 = vsubps_avx(auVar114,auVar27);
                  auVar134._0_4_ = auVar27._0_4_ + auVar114._0_4_;
                  auVar134._4_4_ = auVar27._4_4_ + auVar114._4_4_;
                  auVar134._8_4_ = auVar27._8_4_ + auVar114._8_4_;
                  auVar134._12_4_ = auVar27._12_4_ + auVar114._12_4_;
                  auVar134._16_4_ = auVar27._16_4_ + auVar114._16_4_;
                  auVar134._20_4_ = auVar27._20_4_ + auVar114._20_4_;
                  auVar134._24_4_ = auVar27._24_4_ + auVar114._24_4_;
                  auVar134._28_4_ = auVar27._28_4_ + auVar114._28_4_;
                  auVar27 = vsubps_avx(auVar31,auVar28);
                  auVar104._0_4_ = auVar31._0_4_ + auVar28._0_4_;
                  auVar104._4_4_ = auVar31._4_4_ + auVar28._4_4_;
                  auVar104._8_4_ = auVar31._8_4_ + auVar28._8_4_;
                  auVar104._12_4_ = auVar31._12_4_ + auVar28._12_4_;
                  auVar104._16_4_ = auVar31._16_4_ + auVar28._16_4_;
                  auVar104._20_4_ = auVar31._20_4_ + auVar28._20_4_;
                  auVar104._24_4_ = auVar31._24_4_ + auVar28._24_4_;
                  auVar104._28_4_ = fVar100 + auVar28._28_4_;
                  auVar45._4_4_ = auVar27._4_4_ * auVar134._4_4_;
                  auVar45._0_4_ = auVar27._0_4_ * auVar134._0_4_;
                  auVar45._8_4_ = auVar27._8_4_ * auVar134._8_4_;
                  auVar45._12_4_ = auVar27._12_4_ * auVar134._12_4_;
                  auVar45._16_4_ = auVar27._16_4_ * auVar134._16_4_;
                  auVar45._20_4_ = auVar27._20_4_ * auVar134._20_4_;
                  auVar45._24_4_ = auVar27._24_4_ * auVar134._24_4_;
                  auVar45._28_4_ = fVar100;
                  auVar101 = vfmsub231ps_fma(auVar45,auVar152,auVar104);
                  auVar46._4_4_ = auVar104._4_4_ * auVar29._4_4_;
                  auVar46._0_4_ = auVar104._0_4_ * auVar29._0_4_;
                  auVar46._8_4_ = auVar104._8_4_ * auVar29._8_4_;
                  auVar46._12_4_ = auVar104._12_4_ * auVar29._12_4_;
                  auVar46._16_4_ = auVar104._16_4_ * auVar29._16_4_;
                  auVar46._20_4_ = auVar104._20_4_ * auVar29._20_4_;
                  auVar46._24_4_ = auVar104._24_4_ * auVar29._24_4_;
                  auVar46._28_4_ = auVar104._28_4_;
                  auVar90 = vfmsub231ps_fma(auVar46,auVar27,auVar141);
                  auVar47._4_4_ = auVar152._4_4_ * auVar141._4_4_;
                  auVar47._0_4_ = auVar152._0_4_ * auVar141._0_4_;
                  auVar47._8_4_ = auVar152._8_4_ * auVar141._8_4_;
                  auVar47._12_4_ = auVar152._12_4_ * auVar141._12_4_;
                  auVar47._16_4_ = auVar152._16_4_ * auVar141._16_4_;
                  auVar47._20_4_ = auVar152._20_4_ * auVar141._20_4_;
                  auVar47._24_4_ = auVar152._24_4_ * auVar141._24_4_;
                  auVar47._28_4_ = auVar141._28_4_;
                  auVar130 = vfmsub231ps_fma(auVar47,auVar29,auVar134);
                  auVar142._0_4_ = local_29c0 * auVar130._0_4_;
                  auVar142._4_4_ = local_29c0 * auVar130._4_4_;
                  auVar142._8_4_ = local_29c0 * auVar130._8_4_;
                  auVar142._12_4_ = local_29c0 * auVar130._12_4_;
                  auVar142._16_4_ = local_29c0 * 0.0;
                  auVar142._20_4_ = local_29c0 * 0.0;
                  auVar142._24_4_ = local_29c0 * 0.0;
                  auVar142._28_4_ = 0;
                  auVar90 = vfmadd231ps_fma(auVar142,local_29a0._0_32_,ZEXT1632(auVar90));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_29e0,ZEXT1632(auVar101));
                  fVar100 = auVar90._0_4_ + auVar89._0_4_ + auVar129._0_4_;
                  fVar107 = auVar90._4_4_ + auVar89._4_4_ + auVar129._4_4_;
                  fVar108 = auVar90._8_4_ + auVar89._8_4_ + auVar129._8_4_;
                  fVar109 = auVar90._12_4_ + auVar89._12_4_ + auVar129._12_4_;
                  local_2760 = ZEXT1632(CONCAT412(fVar109,CONCAT48(fVar108,CONCAT44(fVar107,fVar100)
                                                                  )));
                  auVar200 = ZEXT1632(auVar89);
                  auVar151 = vminps_avx(auVar200,ZEXT1632(auVar129));
                  auVar151 = vminps_avx(auVar151,ZEXT1632(auVar90));
                  auVar135._8_4_ = 0x7fffffff;
                  auVar135._0_8_ = 0x7fffffff7fffffff;
                  auVar135._12_4_ = 0x7fffffff;
                  auVar135._16_4_ = 0x7fffffff;
                  auVar135._20_4_ = 0x7fffffff;
                  auVar135._24_4_ = 0x7fffffff;
                  auVar135._28_4_ = 0x7fffffff;
                  local_24e0 = vandps_avx(local_2760,auVar135);
                  fVar166 = local_24e0._0_4_ * 1.1920929e-07;
                  fVar170 = local_24e0._4_4_ * 1.1920929e-07;
                  auVar48._4_4_ = fVar170;
                  auVar48._0_4_ = fVar166;
                  fVar172 = local_24e0._8_4_ * 1.1920929e-07;
                  auVar48._8_4_ = fVar172;
                  fVar174 = local_24e0._12_4_ * 1.1920929e-07;
                  auVar48._12_4_ = fVar174;
                  fVar176 = local_24e0._16_4_ * 1.1920929e-07;
                  auVar48._16_4_ = fVar176;
                  fVar178 = local_24e0._20_4_ * 1.1920929e-07;
                  auVar48._20_4_ = fVar178;
                  fVar180 = local_24e0._24_4_ * 1.1920929e-07;
                  auVar48._24_4_ = fVar180;
                  auVar48._28_4_ = 0x34000000;
                  auVar183._0_8_ = CONCAT44(fVar170,fVar166) ^ 0x8000000080000000;
                  auVar183._8_4_ = -fVar172;
                  auVar183._12_4_ = -fVar174;
                  auVar183._16_4_ = -fVar176;
                  auVar183._20_4_ = -fVar178;
                  auVar183._24_4_ = -fVar180;
                  auVar183._28_4_ = 0xb4000000;
                  auVar151 = vcmpps_avx(auVar151,auVar183,5);
                  auVar159 = ZEXT1632(auVar129);
                  auVar31 = vmaxps_avx(auVar200,auVar159);
                  auVar114 = vmaxps_avx(auVar31,ZEXT1632(auVar90));
                  auVar114 = vcmpps_avx(auVar114,auVar48,2);
                  local_24a0 = vorps_avx(auVar151,auVar114);
                  local_2740 = &local_2a11;
                  auVar28 = local_2540 & local_24a0;
                  context = local_2928;
                  ray = pRVar72;
                  if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar28 >> 0x7f,0) != '\0') ||
                        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar28 >> 0xbf,0) != '\0') ||
                      (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar28[0x1f] < '\0') {
                    auVar49._4_4_ = local_2400._4_4_ * fVar194;
                    auVar49._0_4_ = local_2400._0_4_ * fVar190;
                    auVar49._8_4_ = local_2400._8_4_ * fVar195;
                    auVar49._12_4_ = local_2400._12_4_ * fVar196;
                    auVar49._16_4_ = local_2400._16_4_ * fVar197;
                    auVar49._20_4_ = local_2400._20_4_ * fVar198;
                    auVar49._24_4_ = local_2400._24_4_ * fVar199;
                    auVar49._28_4_ = auVar114._28_4_;
                    auVar50._4_4_ = local_2420._4_4_ * fVar120;
                    auVar50._0_4_ = local_2420._0_4_ * fVar118;
                    auVar50._8_4_ = local_2420._8_4_ * fVar122;
                    auVar50._12_4_ = local_2420._12_4_ * fVar127;
                    auVar50._16_4_ = local_2420._16_4_ * fVar138;
                    auVar50._20_4_ = local_2420._20_4_ * fVar24;
                    auVar50._24_4_ = local_2420._24_4_ * fVar26;
                    auVar50._28_4_ = auVar151._28_4_;
                    local_24c0 = 0x80000000;
                    uStack_24bc = 0x80000000;
                    uStack_24b8 = 0x80000000;
                    uStack_24b4 = 0x80000000;
                    uStack_24b0 = 0x80000000;
                    uStack_24ac = 0x80000000;
                    uStack_24a8 = 0x80000000;
                    uStack_24a4 = 0x80000000;
                    auVar89 = vfmsub213ps_fma(local_2420,local_2480,auVar49);
                    auVar51._4_4_ = auVar152._4_4_ * fVar119;
                    auVar51._0_4_ = auVar152._0_4_ * fVar110;
                    auVar51._8_4_ = auVar152._8_4_ * fVar121;
                    auVar51._12_4_ = auVar152._12_4_ * fVar123;
                    auVar51._16_4_ = auVar152._16_4_ * fVar137;
                    auVar51._20_4_ = auVar152._20_4_ * fVar139;
                    auVar51._24_4_ = auVar152._24_4_ * fVar25;
                    auVar51._28_4_ = 0x34000000;
                    auVar52._4_4_ = auVar27._4_4_ * fVar120;
                    auVar52._0_4_ = auVar27._0_4_ * fVar118;
                    auVar52._8_4_ = auVar27._8_4_ * fVar122;
                    auVar52._12_4_ = auVar27._12_4_ * fVar127;
                    auVar52._16_4_ = auVar27._16_4_ * fVar138;
                    auVar52._20_4_ = auVar27._20_4_ * fVar24;
                    auVar52._24_4_ = auVar27._24_4_ * fVar26;
                    auVar52._28_4_ = auVar31._28_4_;
                    auVar90 = vfmsub213ps_fma(auVar27,local_2440,auVar51);
                    auVar151 = vandps_avx(auVar49,auVar135);
                    auVar114 = vandps_avx(auVar51,auVar135);
                    auVar28 = vcmpps_avx(auVar151,auVar114,1);
                    auVar31 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar89),auVar28);
                    auVar53._4_4_ = fVar194 * auVar29._4_4_;
                    auVar53._0_4_ = fVar190 * auVar29._0_4_;
                    auVar53._8_4_ = fVar195 * auVar29._8_4_;
                    auVar53._12_4_ = fVar196 * auVar29._12_4_;
                    auVar53._16_4_ = fVar197 * auVar29._16_4_;
                    auVar53._20_4_ = fVar198 * auVar29._20_4_;
                    auVar53._24_4_ = fVar199 * auVar29._24_4_;
                    auVar53._28_4_ = auVar28._28_4_;
                    auVar89 = vfmsub213ps_fma(auVar29,local_2480,auVar52);
                    auVar54._4_4_ = local_23e0._4_4_ * fVar119;
                    auVar54._0_4_ = local_23e0._0_4_ * fVar110;
                    auVar54._8_4_ = local_23e0._8_4_ * fVar121;
                    auVar54._12_4_ = local_23e0._12_4_ * fVar123;
                    auVar54._16_4_ = local_23e0._16_4_ * fVar137;
                    auVar54._20_4_ = local_23e0._20_4_ * fVar139;
                    auVar54._24_4_ = local_23e0._24_4_ * fVar25;
                    auVar54._28_4_ = local_2480._28_4_;
                    auVar90 = vfmsub213ps_fma(local_2400,local_2460,auVar54);
                    auVar151 = vandps_avx(auVar54,auVar135);
                    auVar114 = vandps_avx(auVar52,auVar135);
                    auVar151 = vcmpps_avx(auVar151,auVar114,1);
                    auVar27 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar90),auVar151);
                    auVar89 = vfmsub213ps_fma(local_23e0,local_2440,auVar50);
                    auVar90 = vfmsub213ps_fma(auVar152,local_2460,auVar53);
                    auVar151 = vandps_avx(auVar50,auVar135);
                    auVar114 = vandps_avx(auVar53,auVar135);
                    auVar114 = vcmpps_avx(auVar151,auVar114,1);
                    auVar151 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar89),auVar114);
                    fVar110 = auVar151._0_4_;
                    fVar118 = auVar151._4_4_;
                    auVar55._4_4_ = fVar118 * local_29c0;
                    auVar55._0_4_ = fVar110 * local_29c0;
                    fVar119 = auVar151._8_4_;
                    auVar55._8_4_ = fVar119 * local_29c0;
                    fVar120 = auVar151._12_4_;
                    auVar55._12_4_ = fVar120 * local_29c0;
                    fVar121 = auVar151._16_4_;
                    auVar55._16_4_ = fVar121 * local_29c0;
                    fVar122 = auVar151._20_4_;
                    auVar55._20_4_ = fVar122 * local_29c0;
                    fVar123 = auVar151._24_4_;
                    auVar55._24_4_ = fVar123 * local_29c0;
                    auVar55._28_4_ = auVar114._28_4_;
                    auVar89 = vfmadd213ps_fma(local_29a0._0_32_,auVar27,auVar55);
                    auVar89 = vfmadd213ps_fma(local_29e0,auVar31,ZEXT1632(auVar89));
                    fVar127 = auVar89._0_4_ + auVar89._0_4_;
                    fVar137 = auVar89._4_4_ + auVar89._4_4_;
                    fVar138 = auVar89._8_4_ + auVar89._8_4_;
                    fVar139 = auVar89._12_4_ + auVar89._12_4_;
                    auVar152 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar138,CONCAT44(fVar137,fVar127)
                                                                  )));
                    auVar56._4_4_ = fVar118 * fVar171;
                    auVar56._0_4_ = fVar110 * fVar169;
                    auVar56._8_4_ = fVar119 * fVar173;
                    auVar56._12_4_ = fVar120 * fVar175;
                    auVar56._16_4_ = fVar121 * fVar177;
                    auVar56._20_4_ = fVar122 * fVar179;
                    auVar56._24_4_ = fVar123 * fVar23;
                    auVar56._28_4_ = auVar28._28_4_;
                    auVar89 = vfmadd213ps_fma(local_2820,auVar27,auVar56);
                    auVar90 = vfmadd213ps_fma(local_2800,auVar31,ZEXT1632(auVar89));
                    auVar151 = vrcpps_avx(auVar152);
                    auVar184._8_4_ = 0x3f800000;
                    auVar184._0_8_ = &DAT_3f8000003f800000;
                    auVar184._12_4_ = 0x3f800000;
                    auVar184._16_4_ = 0x3f800000;
                    auVar184._20_4_ = 0x3f800000;
                    auVar184._24_4_ = 0x3f800000;
                    auVar184._28_4_ = 0x3f800000;
                    auVar89 = vfnmadd213ps_fma(auVar151,auVar152,auVar184);
                    auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar151,auVar151);
                    uVar1 = *(undefined4 *)((long)&(local_2930->super_RayK<1>).org.field_0 + 0xc);
                    auVar150._4_4_ = uVar1;
                    auVar150._0_4_ = uVar1;
                    auVar150._8_4_ = uVar1;
                    auVar150._12_4_ = uVar1;
                    auVar150._16_4_ = uVar1;
                    auVar150._20_4_ = uVar1;
                    auVar150._24_4_ = uVar1;
                    auVar150._28_4_ = uVar1;
                    local_26c0 = ZEXT1632(CONCAT412(auVar89._12_4_ *
                                                    (auVar90._12_4_ + auVar90._12_4_),
                                                    CONCAT48(auVar89._8_4_ *
                                                             (auVar90._8_4_ + auVar90._8_4_),
                                                             CONCAT44(auVar89._4_4_ *
                                                                      (auVar90._4_4_ + auVar90._4_4_
                                                                      ),auVar89._0_4_ *
                                                                        (auVar90._0_4_ +
                                                                        auVar90._0_4_)))));
                    auVar151 = vcmpps_avx(auVar150,local_26c0,2);
                    auVar163._4_4_ = auVar124._0_4_;
                    auVar163._0_4_ = auVar124._0_4_;
                    auVar163._8_4_ = auVar124._0_4_;
                    auVar163._12_4_ = auVar124._0_4_;
                    auVar163._16_4_ = auVar124._0_4_;
                    auVar163._20_4_ = auVar124._0_4_;
                    auVar163._24_4_ = auVar124._0_4_;
                    auVar163._28_4_ = auVar124._0_4_;
                    auVar114 = vcmpps_avx(local_26c0,auVar163,2);
                    auVar151 = vandps_avx(auVar114,auVar151);
                    auVar164._0_8_ = CONCAT44(fVar137,fVar127) ^ 0x8000000080000000;
                    auVar164._8_4_ = -fVar138;
                    auVar164._12_4_ = -fVar139;
                    auVar164._16_4_ = 0x80000000;
                    auVar164._20_4_ = 0x80000000;
                    auVar164._24_4_ = 0x80000000;
                    auVar164._28_4_ = 0x80000000;
                    auVar114 = vcmpps_avx(auVar164,auVar152,4);
                    auVar151 = vandps_avx(auVar114,auVar151);
                    auVar114 = vandps_avx(local_24a0,local_2540);
                    auVar151 = vpslld_avx2(auVar151,0x1f);
                    auVar152 = vpsrad_avx2(auVar151,0x1f);
                    auVar151 = auVar114 & auVar152;
                    if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar151 >> 0x7f,0) != '\0') ||
                          (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar151 >> 0xbf,0) != '\0') ||
                        (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar151[0x1f] < '\0') {
                      auVar151 = vandps_avx(auVar152,auVar114);
                      local_2740 = &local_2a11;
                      auVar114 = vsubps_avx(local_2760,auVar159);
                      auVar114 = vblendvps_avx(auVar200,auVar114,local_2500);
                      local_2720 = auVar151;
                      auVar152 = vsubps_avx(local_2760,auVar200);
                      auVar152 = vblendvps_avx(auVar159,auVar152,local_2500);
                      local_26a0._4_4_ = auVar31._4_4_ * (float)local_2520._4_4_;
                      local_26a0._0_4_ = auVar31._0_4_ * (float)local_2520._0_4_;
                      local_26a0._8_4_ = auVar31._8_4_ * fStack_2518;
                      local_26a0._12_4_ = auVar31._12_4_ * fStack_2514;
                      local_26a0._16_4_ = auVar31._16_4_ * fStack_2510;
                      local_26a0._20_4_ = auVar31._20_4_ * fStack_250c;
                      local_26a0._24_4_ = auVar31._24_4_ * fStack_2508;
                      local_26a0._28_4_ = 0;
                      local_2680[0] = (float)local_2520._0_4_ * auVar27._0_4_;
                      local_2680[1] = (float)local_2520._4_4_ * auVar27._4_4_;
                      local_2680[2] = fStack_2518 * auVar27._8_4_;
                      local_2680[3] = fStack_2514 * auVar27._12_4_;
                      fStack_2670 = fStack_2510 * auVar27._16_4_;
                      fStack_266c = fStack_250c * auVar27._20_4_;
                      fStack_2668 = fStack_2508 * auVar27._24_4_;
                      uStack_2664 = auVar27._28_4_;
                      local_2660[0] = (float)local_2520._0_4_ * fVar110;
                      local_2660[1] = (float)local_2520._4_4_ * fVar118;
                      local_2660[2] = fStack_2518 * fVar119;
                      local_2660[3] = fStack_2514 * fVar120;
                      fStack_2650 = fStack_2510 * fVar121;
                      fStack_264c = fStack_250c * fVar122;
                      fStack_2648 = fStack_2508 * fVar123;
                      uStack_2644 = auVar27._28_4_;
                      auVar98._0_8_ = (ulong)CONCAT24(uVar13,(uint)uVar13) & 0x7fff00007fff;
                      auVar98._8_4_ = local_29f8;
                      auVar98._12_4_ = local_29f8;
                      auVar98._16_4_ = local_29f8;
                      auVar98._20_4_ = local_29f8;
                      auVar98._24_4_ = local_29f8;
                      auVar98._28_4_ = local_29f8;
                      auVar31 = vpaddd_avx2(auVar98,_DAT_0205d4c0);
                      auVar117._0_8_ = (ulong)CONCAT24(uVar14,(uint)uVar14) & 0x7fff00007fff;
                      auVar117._8_4_ = local_29fc;
                      auVar117._12_4_ = local_29fc;
                      auVar117._16_4_ = local_29fc;
                      auVar117._20_4_ = local_29fc;
                      auVar117._24_4_ = local_29fc;
                      auVar117._28_4_ = local_29fc;
                      auVar27 = vpaddd_avx2(auVar117,_DAT_0205d4e0);
                      auVar113._0_4_ = (float)(int)(*(ushort *)(local_2918 + 8 + local_2920) - 1);
                      auVar113._4_12_ = auVar129._4_12_;
                      auVar89 = vrcpss_avx(auVar113,auVar113);
                      auVar90 = vfnmadd213ss_fma(auVar113,auVar89,SUB6416(ZEXT464(0x40000000),0));
                      fStack_2784 = auVar89._0_4_ * auVar90._0_4_;
                      auVar145._0_4_ = (float)(int)(*(ushort *)(local_2918 + 10 + local_2920) - 1);
                      auVar145._4_12_ = auVar129._4_12_;
                      auVar89 = vrcpss_avx(auVar145,auVar145);
                      auVar129 = vfnmadd213ss_fma(auVar145,auVar89,SUB6416(ZEXT464(0x40000000),0));
                      fStack_2764 = auVar89._0_4_ * auVar129._0_4_;
                      auVar31 = vcvtdq2ps_avx(auVar31);
                      local_27a0._0_4_ = (fVar100 * auVar31._0_4_ + auVar114._0_4_) * fStack_2784;
                      local_27a0._4_4_ = (fVar107 * auVar31._4_4_ + auVar114._4_4_) * fStack_2784;
                      fStack_2798 = (fVar108 * auVar31._8_4_ + auVar114._8_4_) * fStack_2784;
                      fStack_2794 = (fVar109 * auVar31._12_4_ + auVar114._12_4_) * fStack_2784;
                      fStack_2790 = (auVar31._16_4_ * 0.0 + auVar114._16_4_) * fStack_2784;
                      fStack_278c = (auVar31._20_4_ * 0.0 + auVar114._20_4_) * fStack_2784;
                      fStack_2788 = (auVar31._24_4_ * 0.0 + auVar114._24_4_) * fStack_2784;
                      auVar114 = vcvtdq2ps_avx(auVar27);
                      local_2780 = (fVar100 * auVar114._0_4_ + auVar152._0_4_) * fStack_2764;
                      fStack_277c = (fVar107 * auVar114._4_4_ + auVar152._4_4_) * fStack_2764;
                      fStack_2778 = (fVar108 * auVar114._8_4_ + auVar152._8_4_) * fStack_2764;
                      fStack_2774 = (fVar109 * auVar114._12_4_ + auVar152._12_4_) * fStack_2764;
                      fStack_2770 = (auVar114._16_4_ * 0.0 + auVar152._16_4_) * fStack_2764;
                      fStack_276c = (auVar114._20_4_ * 0.0 + auVar152._20_4_) * fStack_2764;
                      fStack_2768 = (auVar114._24_4_ * 0.0 + auVar152._24_4_) * fStack_2764;
                      pGVar17 = (local_2910->geometries).items[uVar75].ptr;
                      if ((pGVar17->mask & (local_2930->super_RayK<1>).mask) != 0) {
                        auVar144 = ZEXT3264(local_26c0);
                        local_27e0 = auVar151;
                        auVar114 = vrcpps_avx(local_2760);
                        auVar143._8_4_ = 0x3f800000;
                        auVar143._0_8_ = &DAT_3f8000003f800000;
                        auVar143._12_4_ = 0x3f800000;
                        auVar143._16_4_ = 0x3f800000;
                        auVar143._20_4_ = 0x3f800000;
                        auVar143._24_4_ = 0x3f800000;
                        auVar143._28_4_ = 0x3f800000;
                        auVar89 = vfnmadd213ps_fma(local_2760,auVar114,auVar143);
                        auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar114,auVar114);
                        auVar136._8_4_ = 0x219392ef;
                        auVar136._0_8_ = 0x219392ef219392ef;
                        auVar136._12_4_ = 0x219392ef;
                        auVar136._16_4_ = 0x219392ef;
                        auVar136._20_4_ = 0x219392ef;
                        auVar136._24_4_ = 0x219392ef;
                        auVar136._28_4_ = 0x219392ef;
                        auVar114 = vcmpps_avx(local_24e0,auVar136,5);
                        auVar114 = vandps_avx(auVar114,ZEXT1632(auVar89));
                        auVar57._4_4_ = (float)local_27a0._4_4_ * auVar114._4_4_;
                        auVar57._0_4_ = (float)local_27a0._0_4_ * auVar114._0_4_;
                        auVar57._8_4_ = fStack_2798 * auVar114._8_4_;
                        auVar57._12_4_ = fStack_2794 * auVar114._12_4_;
                        auVar57._16_4_ = fStack_2790 * auVar114._16_4_;
                        auVar57._20_4_ = fStack_278c * auVar114._20_4_;
                        auVar57._24_4_ = fStack_2788 * auVar114._24_4_;
                        auVar57._28_4_ = fStack_2784;
                        local_2700 = vminps_avx(auVar57,auVar143);
                        auVar58._4_4_ = fStack_277c * auVar114._4_4_;
                        auVar58._0_4_ = local_2780 * auVar114._0_4_;
                        auVar58._8_4_ = fStack_2778 * auVar114._8_4_;
                        auVar58._12_4_ = fStack_2774 * auVar114._12_4_;
                        auVar58._16_4_ = fStack_2770 * auVar114._16_4_;
                        auVar58._20_4_ = fStack_276c * auVar114._20_4_;
                        auVar58._24_4_ = fStack_2768 * auVar114._24_4_;
                        auVar58._28_4_ = auVar114._28_4_;
                        local_26e0 = vminps_avx(auVar58,auVar143);
                        auVar105._8_4_ = 0x7f800000;
                        auVar105._0_8_ = 0x7f8000007f800000;
                        auVar105._12_4_ = 0x7f800000;
                        auVar105._16_4_ = 0x7f800000;
                        auVar105._20_4_ = 0x7f800000;
                        auVar105._24_4_ = 0x7f800000;
                        auVar105._28_4_ = 0x7f800000;
                        auVar114 = vblendvps_avx(auVar105,local_26c0,auVar151);
                        auVar31 = vshufps_avx(auVar114,auVar114,0xb1);
                        auVar31 = vminps_avx(auVar114,auVar31);
                        auVar152 = vshufpd_avx(auVar31,auVar31,5);
                        auVar31 = vminps_avx(auVar31,auVar152);
                        auVar152 = vpermpd_avx2(auVar31,0x4e);
                        auVar31 = vminps_avx(auVar31,auVar152);
                        auVar114 = vcmpps_avx(auVar114,auVar31,0);
                        auVar31 = auVar151 & auVar114;
                        if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar31 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar31 >> 0x7f,0) != '\0') ||
                              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar31 >> 0xbf,0) != '\0') ||
                            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar31[0x1f] < '\0') {
                          auVar151 = vandps_avx(auVar114,auVar151);
                        }
                        uVar74 = vmovmskps_avx(auVar151);
                        uVar16 = 0;
                        for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                          uVar16 = uVar16 + 1;
                        }
                        uVar77 = (ulong)uVar16;
                        pRVar21 = local_2928->args;
                        if ((pRVar21->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          auVar124._0_4_ = *(float *)(local_2700 + uVar77 * 4);
                          fVar169 = *(float *)(local_26e0 + uVar77 * 4);
                          fVar171 = local_2680[uVar77 - 8];
                          fVar173 = local_2680[uVar77];
                          fVar175 = local_2660[uVar77];
                          (local_2930->super_RayK<1>).tfar = *(float *)(local_26c0 + uVar77 * 4);
                          (local_2930->Ng).field_0.field_0.x = fVar171;
                          (local_2930->Ng).field_0.field_0.y = fVar173;
                          (local_2930->Ng).field_0.field_0.z = fVar175;
                          local_2930->u = auVar124._0_4_;
                          local_2930->v = fVar169;
                          local_2930->primID = uVar81;
                          local_2930->geomID = uVar15;
                          pRVar22 = local_2928->user;
                          local_2930->instID[0] = pRVar22->instID[0];
                          local_2930->instPrimID[0] = pRVar22->instPrimID[0];
                        }
                        else {
                          local_29a0._0_8_ = local_2928->user;
                          local_29e0 = local_26c0;
                          local_2a08 = uVar75;
                          do {
                            local_28c4 = *(undefined4 *)(local_2700 + uVar77 * 4);
                            local_28c0 = *(undefined4 *)(local_26e0 + uVar77 * 4);
                            local_29c0 = (pRVar72->super_RayK<1>).tfar;
                            (pRVar72->super_RayK<1>).tfar = *(float *)(local_26c0 + uVar77 * 4);
                            local_28d0 = local_2680[uVar77 - 8];
                            local_28cc = local_2680[uVar77];
                            local_28c8 = local_2660[uVar77];
                            local_28bc = (int)local_29e8;
                            local_28b8 = (int)uVar75;
                            local_28b4 = *(uint *)local_29a0._0_8_;
                            local_28b0 = *(uint *)(local_29a0._0_8_ + 4);
                            local_29f4 = -1;
                            local_2900.valid = &local_29f4;
                            local_2900.geometryUserPtr = pGVar17->userPtr;
                            local_2900.context = (RTCRayQueryContext *)local_29a0._0_8_;
                            local_2900.ray = (RTCRayN *)pRVar72;
                            local_2900.hit = (RTCHitN *)&local_28d0;
                            local_2900.N = 1;
                            if (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a77d1b:
                              if (pRVar21->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar21->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar17->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar21->filter)(&local_2900);
                                  auVar144 = ZEXT3264(local_29e0);
                                  uVar75 = local_2a08;
                                }
                                if (*local_2900.valid == 0) goto LAB_01a77db1;
                              }
                              (((Vec3f *)((long)local_2900.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_2900.hit;
                              (((Vec3f *)((long)local_2900.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_2900.hit + 4);
                              (((Vec3f *)((long)local_2900.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_2900.hit + 8);
                              *(float *)((long)local_2900.ray + 0x3c) =
                                   *(float *)(local_2900.hit + 0xc);
                              *(float *)((long)local_2900.ray + 0x40) =
                                   *(float *)(local_2900.hit + 0x10);
                              *(float *)((long)local_2900.ray + 0x44) =
                                   *(float *)(local_2900.hit + 0x14);
                              *(float *)((long)local_2900.ray + 0x48) =
                                   *(float *)(local_2900.hit + 0x18);
                              *(float *)((long)local_2900.ray + 0x4c) =
                                   *(float *)(local_2900.hit + 0x1c);
                              *(float *)((long)local_2900.ray + 0x50) =
                                   *(float *)(local_2900.hit + 0x20);
                            }
                            else {
                              (*pGVar17->intersectionFilterN)(&local_2900);
                              auVar144 = ZEXT3264(local_29e0);
                              uVar75 = local_2a08;
                              if (*local_2900.valid != 0) goto LAB_01a77d1b;
LAB_01a77db1:
                              (pRVar72->super_RayK<1>).tfar = local_29c0;
                            }
                            auVar124._0_4_ = (pRVar72->super_RayK<1>).tfar;
                            auVar99._4_4_ = auVar124._0_4_;
                            auVar99._0_4_ = auVar124._0_4_;
                            auVar99._8_4_ = auVar124._0_4_;
                            auVar99._12_4_ = auVar124._0_4_;
                            auVar99._16_4_ = auVar124._0_4_;
                            auVar99._20_4_ = auVar124._0_4_;
                            auVar99._24_4_ = auVar124._0_4_;
                            auVar99._28_4_ = auVar124._0_4_;
                            *(undefined4 *)(local_27e0 + uVar77 * 4) = 0;
                            auVar31 = local_27e0;
                            auVar114 = vcmpps_avx(auVar144._0_32_,auVar99,2);
                            auVar151 = vandps_avx(auVar114,local_27e0);
                            local_27e0 = auVar151;
                            auVar31 = auVar31 & auVar114;
                            bVar65 = (auVar31 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar66 = (auVar31 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar64 = (auVar31 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar63 = SUB321(auVar31 >> 0x7f,0) != '\0';
                            bVar62 = (auVar31 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar61 = SUB321(auVar31 >> 0xbf,0) != '\0';
                            bVar60 = (auVar31 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar59 = auVar31[0x1f] < '\0';
                            if (((((((bVar65 || bVar66) || bVar64) || bVar63) || bVar62) || bVar61)
                                || bVar60) || bVar59) {
                              auVar106._8_4_ = 0x7f800000;
                              auVar106._0_8_ = 0x7f8000007f800000;
                              auVar106._12_4_ = 0x7f800000;
                              auVar106._16_4_ = 0x7f800000;
                              auVar106._20_4_ = 0x7f800000;
                              auVar106._24_4_ = 0x7f800000;
                              auVar106._28_4_ = 0x7f800000;
                              auVar114 = vblendvps_avx(auVar106,auVar144._0_32_,auVar151);
                              auVar31 = vshufps_avx(auVar114,auVar114,0xb1);
                              auVar31 = vminps_avx(auVar114,auVar31);
                              auVar152 = vshufpd_avx(auVar31,auVar31,5);
                              auVar31 = vminps_avx(auVar31,auVar152);
                              auVar152 = vpermpd_avx2(auVar31,0x4e);
                              auVar31 = vminps_avx(auVar31,auVar152);
                              auVar114 = vcmpps_avx(auVar114,auVar31,0);
                              auVar31 = auVar151 & auVar114;
                              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar31 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar31 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar31 >> 0x7f,0) != '\0')
                                    || (auVar31 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar31 >> 0xbf,0) != '\0')
                                  || (auVar31 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar31[0x1f] < '\0') {
                                auVar151 = vandps_avx(auVar114,auVar151);
                              }
                              uVar81 = vmovmskps_avx(auVar151);
                              uVar15 = 0;
                              for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                                uVar15 = uVar15 + 1;
                              }
                              uVar77 = (ulong)uVar15;
                            }
                          } while (((((((bVar65 || bVar66) || bVar64) || bVar63) || bVar62) ||
                                    bVar61) || bVar60) || bVar59);
                        }
                      }
                    }
                  }
                }
                local_2908 = local_2908 - 1 & local_2908;
              } while (local_2908 != 0);
            }
            local_2940 = local_2940 + 1;
          } while (local_2940 != local_2978);
        }
        local_2840 = (ray->super_RayK<1>).tfar;
        fStack_283c = local_2840;
        fStack_2838 = local_2840;
        fStack_2834 = local_2840;
        fStack_2830 = local_2840;
        fStack_282c = local_2840;
        fStack_2828 = local_2840;
        fStack_2824 = local_2840;
        auVar160 = ZEXT3264(local_2860);
        auVar144 = ZEXT3264(local_2880);
        auVar165 = ZEXT3264(_local_2640);
        auVar124._0_4_ = local_2620;
        fVar169 = fStack_261c;
        fVar171 = fStack_2618;
        fVar173 = fStack_2614;
        fVar175 = fStack_2610;
        fVar177 = fStack_260c;
        fVar179 = fStack_2608;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }